

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O2

size_t sei_render(sei_t *sei,uint8_t *data)

{
  sei_message_t *psVar1;
  int iVar2;
  size_t sVar3;
  sei_msgtype_t sVar4;
  size_t sVar5;
  long lVar6;
  uint8_t *puVar7;
  sei_message_t **ppsVar8;
  uint8_t *data_00;
  
  if ((sei == (sei_t *)0x0) || (sei->head == (sei_message_t *)0x0)) {
LAB_00106682:
    sVar5 = 0;
  }
  else {
    *data = '\x06';
    puVar7 = data + 1;
    sVar5 = 2;
    ppsVar8 = &sei->head;
    while (psVar1 = *ppsVar8, psVar1 != (sei_message_t *)0x0) {
      iVar2 = (int)psVar1->size;
      data_00 = puVar7 + 2;
      lVar6 = sVar5 + 2;
      for (sVar4 = psVar1->type; 0xfe < (int)sVar4; sVar4 = sVar4 - 0xff) {
        *puVar7 = 0xff;
        puVar7 = puVar7 + 1;
        data_00 = data_00 + 1;
        lVar6 = lVar6 + 1;
      }
      *puVar7 = (uint8_t)sVar4;
      sVar5 = (size_t)iVar2;
      for (; 0xfe < iVar2; iVar2 = iVar2 + -0xff) {
        data_00[-1] = 0xff;
        data_00 = data_00 + 1;
        lVar6 = lVar6 + 1;
        sVar5 = sVar5 - 0xff;
      }
      data_00[-1] = (uint8_t)iVar2;
      sVar3 = _copy_from_rbsp(data_00,(uint8_t *)(psVar1 + 1),sVar5);
      if (sVar3 == 0) goto LAB_00106682;
      sVar5 = lVar6 + sVar3;
      puVar7 = data_00 + sVar3;
      ppsVar8 = &psVar1->next;
    }
    *puVar7 = 0x80;
  }
  return sVar5;
}

Assistant:

size_t sei_render(sei_t* sei, uint8_t* data)
{
    if (!sei || !sei->head) {
        return 0;
    }

    size_t escaped_size, size = 2; // nalu_type + stop bit
    sei_message_t* msg;
    (*data) = 6;
    ++data;

    for (msg = sei_message_head(sei); msg; msg = sei_message_next(msg)) {
        int payloadType = sei_message_type(msg);
        int payloadSize = (int)sei_message_size(msg);
        uint8_t* payloadData = sei_message_data(msg);

        while (255 <= payloadType) {
            (*data) = 255;
            ++data;
            ++size;
            payloadType -= 255;
        }

        (*data) = payloadType;
        ++data;
        ++size;

        while (255 <= payloadSize) {
            (*data) = 255;
            ++data;
            ++size;
            payloadSize -= 255;
        }

        (*data) = payloadSize;
        ++data;
        ++size;

        if (0 >= (escaped_size = _copy_from_rbsp(data, payloadData, payloadSize))) {
            return 0;
        }

        data += escaped_size;
        size += escaped_size;
    }

    // write stop bit and return
    (*data) = 0x80;
    return size;
}